

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<long,libdivide::divider<long,(libdivide::Branching)0>>
                   (random_numerators<long> *vals,divider<long,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  ulong *puVar7;
  ulong *in_RSI;
  random_numerators<long> *in_RDI;
  const_iterator iter;
  UIntT sum;
  int64_t q_1;
  int64_t sign_1;
  uint64_t uq_1;
  int64_t sign;
  int64_t q;
  uint64_t uq;
  uint64_t mask;
  uint8_t shift;
  __int128_t rl;
  __int128_t yl;
  __int128_t xl;
  random_numerators<long> *in_stack_fffffffffffffef0;
  random_numerators<long> *prVar8;
  ulong *local_100;
  uint64_t local_f8;
  long local_90;
  long local_50;
  
  local_f8 = 0;
  local_100 = (ulong *)random_numerators<long>::begin(in_RDI);
  while( true ) {
    puVar7 = (ulong *)random_numerators<long>::end(in_stack_fffffffffffffef0);
    if (local_100 == puVar7) break;
    uVar2 = *local_100;
    uVar3 = *in_RSI;
    bVar1 = (byte)in_RSI[1];
    bVar6 = bVar1 & 0x3f;
    prVar8 = (random_numerators<long> *)((long)uVar2 >> 0x3f);
    if (uVar3 == 0) {
      local_50 = ((long)(uVar2 + ((ulong)prVar8 & (1L << bVar6) - 1U)) >> bVar6 ^
                 (long)((int)(char)bVar1 >> 7)) - (long)((int)(char)bVar1 >> 7);
      prVar8 = in_stack_fffffffffffffef0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar3;
      local_90 = SUB168(auVar4 * auVar5,8) + uVar2 * ((long)uVar3 >> 0x3f) + (long)prVar8 * uVar3;
      if ((bVar1 & 0x40) != 0) {
        local_90 = ((uVar2 ^ (long)((int)(char)bVar1 >> 7)) - (long)((int)(char)bVar1 >> 7)) +
                   local_90;
      }
      local_50 = (ulong)(local_90 >> bVar6 < 0) + (local_90 >> bVar6);
    }
    local_f8 = local_50 + local_f8;
    local_100 = local_100 + 1;
    in_stack_fffffffffffffef0 = prVar8;
  }
  return local_f8;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}